

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O2

void aom_highbd_dc_top_predictor_4x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __m128i dc;
  ushort local_18;
  ushort uStack_16;
  ushort uStack_14;
  ushort uStack_12;
  ushort uStack_10;
  ushort uStack_e;
  ushort uStack_c;
  ushort uStack_a;
  
  uVar1 = *(ulong *)above;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  auVar3 = pshuflw(in_XMM1,auVar2,0xe);
  auVar4._0_2_ = auVar3._0_2_ + (short)uVar1;
  auVar4._2_2_ = auVar3._2_2_ + (short)(uVar1 >> 0x10);
  auVar4._4_2_ = auVar3._4_2_ + (short)(uVar1 >> 0x20);
  auVar4._6_2_ = auVar3._6_2_ + (short)(uVar1 >> 0x30);
  auVar4._8_2_ = auVar3._8_2_;
  auVar4._10_2_ = auVar3._10_2_;
  auVar4._12_2_ = auVar3._12_2_;
  auVar4._14_2_ = auVar3._14_2_;
  auVar2 = pshuflw(auVar2,auVar4,1);
  local_18 = (ushort)(auVar2._0_2_ + auVar4._0_2_ + 2U) >> 2;
  uStack_16 = (ushort)(auVar2._2_2_ + auVar4._2_2_) >> 2;
  uStack_14 = (ushort)(auVar2._4_2_ + auVar4._4_2_) >> 2;
  uStack_12 = (ushort)(auVar2._6_2_ + auVar4._6_2_) >> 2;
  uStack_10 = (ushort)(auVar2._8_2_ + auVar4._8_2_) >> 2;
  uStack_e = (ushort)(auVar2._10_2_ + auVar4._10_2_) >> 2;
  uStack_c = (ushort)(auVar2._12_2_ + auVar4._12_2_) >> 2;
  uStack_a = (ushort)(auVar2._14_2_ + auVar4._14_2_) >> 2;
  dc_store_4x8(dst,stride,(__m128i *)&local_18);
  return;
}

Assistant:

void aom_highbd_dc_top_predictor_4x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                          const uint16_t *above,
                                          const uint16_t *left, int bd) {
  const __m128i two = _mm_cvtsi32_si128(2);
  const __m128i sum = dc_sum_4(above);
  const __m128i dc = _mm_srli_epi16(_mm_add_epi16(sum, two), 2);
  (void)left;
  (void)bd;
  dc_store_4x8(dst, stride, &dc);
}